

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O0

void __thiscall
ear::PolarExtent::PolarExtent
          (PolarExtent *this,shared_ptr<ear::PointSourcePanner> *psp_,
          unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_> *core_impl_)

{
  int iVar1;
  element_type *peVar2;
  size_t n;
  size_t n_00;
  pointer pPVar3;
  undefined4 extraout_var;
  size_t sVar4;
  extent_float_t *peVar5;
  Scalar *pSVar6;
  ulong uVar7;
  long lVar8;
  ulong local_f0;
  size_t p_1;
  size_t batch;
  size_t s;
  size_t p;
  size_t num_batches;
  anon_class_8_1_8991fb9c malloc_float;
  size_t batch_size;
  size_t num_points;
  size_t num_speakers;
  undefined1 local_68 [8];
  MatrixXd panning_results;
  MatrixXd panning_positions;
  int local_24;
  unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_> *local_20;
  unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_> *core_impl__local;
  shared_ptr<ear::PointSourcePanner> *psp__local;
  PolarExtent *this_local;
  
  local_20 = core_impl_;
  core_impl__local =
       (unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_> *)psp_;
  psp__local = (shared_ptr<ear::PointSourcePanner> *)this;
  std::unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>::unique_ptr
            (&this->core_impl,core_impl_);
  std::shared_ptr<ear::PointSourcePanner>::shared_ptr
            (&this->psp,(shared_ptr<ear::PointSourcePanner> *)core_impl__local);
  peVar2 = std::
           __shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->psp);
  local_24 = (*peVar2->_vptr_PointSourcePanner[1])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&this->pvsMin,&local_24);
  peVar2 = std::
           __shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->psp);
  panning_positions.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols._0_4_ = (*peVar2->_vptr_PointSourcePanner[1])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            (&this->pvsMax,
             (int *)&panning_positions.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols);
  anon_unknown_0::generatePanningPositionsEven
            ((MatrixXd *)
             &panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols,0x25);
  Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)&num_speakers
             ,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              &panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols,(type *)0x0);
  anon_unknown_0::generatePanningPositionsResults
            ((MatrixXd *)local_68,&this->psp,
             (Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
             &num_speakers);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::~Ref
            ((Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)
             &num_speakers);
  n = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_68);
  n_00 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                   ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_68);
  pPVar3 = std::unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>::
           operator->(&this->core_impl);
  iVar1 = (*pPVar3->_vptr_PolarExtentCore[3])();
  malloc_float.this = (PolarExtent *)CONCAT44(extraout_var,iVar1);
  (this->ctx).real_num_speakers = n;
  sVar4 = anon_unknown_0::round_up(n,(size_t)malloc_float.this);
  (this->ctx).num_speakers = sVar4;
  sVar4 = anon_unknown_0::round_up(n_00,(size_t)malloc_float.this);
  (this->ctx).num_points = sVar4;
  num_batches = (size_t)this;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&num_batches,(this->ctx).num_points);
  (this->ctx).xs = peVar5;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&num_batches,(this->ctx).num_points);
  (this->ctx).ys = peVar5;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&num_batches,(this->ctx).num_points);
  (this->ctx).zs = peVar5;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&num_batches,
                      (this->ctx).num_points * (this->ctx).num_speakers);
  (this->ctx).panning_results = peVar5;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&num_batches,
                      ((this->ctx).num_points / (ulong)malloc_float.this) * (this->ctx).num_speakers
                     );
  (this->ctx).summed_panning_results = peVar5;
  peVar5 = PolarExtent::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)&num_batches,(this->ctx).num_speakers);
  (this->ctx).results = peVar5;
  for (s = 0; local_f0 = n_00, s < n_00; s = s + 1) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_results.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols,s,0);
    (this->ctx).xs[s] = (float)*pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_results.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols,s,1);
    (this->ctx).ys[s] = (float)*pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_results.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols,s,2);
    (this->ctx).zs[s] = (float)*pSVar6;
    for (batch = 0; batch < n; batch = batch + 1) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_68,
                          batch,s);
      (this->ctx).panning_results[batch * (this->ctx).num_points + s] = (float)*pSVar6;
      uVar7 = s / (ulong)malloc_float.this;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_68,
                          batch,s);
      peVar5 = (this->ctx).summed_panning_results;
      lVar8 = uVar7 * (this->ctx).num_speakers + batch;
      peVar5[lVar8] = (float)*pSVar6 + peVar5[lVar8];
    }
  }
  for (; local_f0 < (this->ctx).num_points; local_f0 = local_f0 + 1) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_results.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols,n_00 - 1,0);
    (this->ctx).xs[local_f0] = (float)*pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_results.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols,n_00 - 1,1);
    (this->ctx).ys[local_f0] = (float)*pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        &panning_results.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols,n_00 - 1,2);
    (this->ctx).zs[local_f0] = (float)*pSVar6;
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_68);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &panning_results.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  return;
}

Assistant:

PolarExtent::PolarExtent(const std::shared_ptr<PointSourcePanner> &psp_,
                           std::unique_ptr<PolarExtentCore> core_impl_)
      : core_impl(std::move(core_impl_)),
        psp(psp_),
        pvsMin(psp->numberOfOutputChannels()),
        pvsMax(psp->numberOfOutputChannels()) {
    auto panning_positions = generatePanningPositionsEven(nRows);
    auto panning_results =
        generatePanningPositionsResults(psp, panning_positions);

    size_t num_speakers = panning_results.rows();
    size_t num_points = panning_results.cols();
    size_t batch_size = core_impl->batch_size();
    ctx.real_num_speakers = num_speakers;
    ctx.num_speakers = round_up(num_speakers, batch_size);
    ctx.num_points = round_up(num_points, batch_size);

    // use regular malloc and free for memory management. reasoning:
    // - the parts compiled with different architectures should not use any
    //   in-line functions which could get merged; therefore using any kind of
    //   smart pointer in the interface is a bad plan
    // - we could use a smart pointer and extract a float pointer, but that
    //   doesn't make it much cleaner, would still break copying, and would
    //   ultimately be more code
    // - using smart pointers would be awkward anyway, as the alignment is
    //   known at run-time
    auto malloc_float = [&](size_t n) {
      auto mem = (extent_float_t *)xsimd::aligned_malloc(
          sizeof(extent_float_t) * n, core_impl->alignment());
      for (size_t i = 0; i < n; i++) mem[i] = 0.0;
      return mem;
    };

    ctx.xs = malloc_float(ctx.num_points);
    ctx.ys = malloc_float(ctx.num_points);
    ctx.zs = malloc_float(ctx.num_points);

    ctx.panning_results = malloc_float(ctx.num_points * ctx.num_speakers);
    size_t num_batches = ctx.num_points / batch_size;
    ctx.summed_panning_results = malloc_float(num_batches * ctx.num_speakers);

    ctx.results = malloc_float(ctx.num_speakers);

    for (size_t p = 0; p < num_points; p++) {
      ctx.xs[p] = static_cast<extent_float_t>(panning_positions(p, 0));
      ctx.ys[p] = static_cast<extent_float_t>(panning_positions(p, 1));
      ctx.zs[p] = static_cast<extent_float_t>(panning_positions(p, 2));

      for (size_t s = 0; s < num_speakers; s++) {
        ctx.panning_results[s * ctx.num_points + p] =
            static_cast<extent_float_t>(panning_results(s, p));
        size_t batch = p / batch_size;
        ctx.summed_panning_results[batch * ctx.num_speakers + s] +=
            static_cast<extent_float_t>(panning_results(s, p));
      }
    }

    for (size_t p = num_points; p < ctx.num_points; p++) {
      // the results of these will be ignored; make them consistent with the
      // rest of the batch
      ctx.xs[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 0));
      ctx.ys[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 1));
      ctx.zs[p] =
          static_cast<extent_float_t>(panning_positions(num_points - 1, 2));
    }
  }